

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void diff_ordset_free(ly_set *set)

{
  lys_node *__ptr;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (set != (ly_set *)0x0) {
    for (uVar3 = 0; uVar3 < set->number; uVar3 = uVar3 + 1) {
      __ptr = (set->set).s[uVar3];
      lVar2 = 0x10;
      for (uVar1 = 0; uVar1 < *(uint *)&__ptr->ref; uVar1 = uVar1 + 1) {
        free(*(void **)((long)*(void **)&__ptr->flags + lVar2));
        lVar2 = lVar2 + 0x18;
      }
      free(*(void **)&__ptr->flags);
      free(__ptr);
    }
    ly_set_free(set);
    return;
  }
  return;
}

Assistant:

static void
diff_ordset_free(struct ly_set *set)
{
    unsigned int i, j;
    struct diff_ordered *ord;

    if (!set) {
        return;
    }

    for (i = 0; i < set->number; i++) {
        ord = (struct diff_ordered *)set->set.g[i];
        for (j = 0; j < ord->count; j++) {
            free(ord->items[j].dist);
        }
        free(ord->items);
        free(ord);
    }

    ly_set_free(set);
}